

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

Frame * rw::cloneRecurse(Frame *old,Frame *newroot)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint8 uVar5;
  uint8 uVar6;
  uint8 uVar7;
  float32 fVar8;
  float32 fVar9;
  float32 fVar10;
  float32 fVar11;
  float32 fVar12;
  float32 fVar13;
  float32 fVar14;
  Frame *dst;
  Frame *pFVar15;
  Frame *old_00;
  
  dst = Frame::create();
  if (newroot == (Frame *)0x0) {
    newroot = dst;
  }
  uVar5 = (old->object).subType;
  uVar6 = (old->object).flags;
  uVar7 = (old->object).privateFlags;
  (dst->object).type = (old->object).type;
  (dst->object).subType = uVar5;
  (dst->object).flags = uVar6;
  (dst->object).privateFlags = uVar7;
  (dst->object).parent = (void *)0x0;
  fVar13 = (old->matrix).right.x;
  fVar14 = (old->matrix).right.y;
  uVar1 = *(undefined8 *)&(old->matrix).right.z;
  fVar11 = (old->matrix).up.x;
  fVar12 = (old->matrix).up.y;
  uVar2 = *(undefined8 *)&(old->matrix).up.z;
  fVar9 = (old->matrix).at.x;
  fVar10 = (old->matrix).at.y;
  uVar3 = *(undefined8 *)&(old->matrix).at.z;
  fVar8 = (old->matrix).pos.y;
  uVar4 = *(undefined8 *)&(old->matrix).pos.z;
  (dst->matrix).pos.x = (old->matrix).pos.x;
  (dst->matrix).pos.y = fVar8;
  *(undefined8 *)&(dst->matrix).pos.z = uVar4;
  (dst->matrix).at.x = fVar9;
  (dst->matrix).at.y = fVar10;
  *(undefined8 *)&(dst->matrix).at.z = uVar3;
  (dst->matrix).up.x = fVar11;
  (dst->matrix).up.y = fVar12;
  *(undefined8 *)&(dst->matrix).up.z = uVar2;
  (dst->matrix).right.x = fVar13;
  (dst->matrix).right.y = fVar14;
  *(undefined8 *)&(dst->matrix).right.z = uVar1;
  dst->root = newroot;
  old->root = dst;
  for (old_00 = old->child; old_00 != (Frame *)0x0; old_00 = old_00->next) {
    pFVar15 = cloneRecurse(old_00,newroot);
    pFVar15->next = dst->child;
    dst->child = pFVar15;
    (pFVar15->object).parent = dst;
  }
  PluginList::copy((PluginList *)&Frame::s_plglist,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)old);
  return dst;
}

Assistant:

static Frame*
cloneRecurse(Frame *old, Frame *newroot)
{
	Frame *frame = Frame::create();
	if(newroot == nil)
		newroot = frame;
	frame->object.copy(&old->object);
	frame->matrix = old->matrix;
	frame->root = newroot;
	old->root = frame;	// Remember cloned frame
	for(Frame *child = old->child; child; child = child->next){
		Frame *clonedchild = cloneRecurse(child, newroot);
		clonedchild->next = frame->child;
		frame->child = clonedchild;
		clonedchild->object.parent = frame;
	}
	Frame::s_plglist.copy(frame, old);
	return frame;
}